

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

IfcFloat Assimp::IFC::RecursiveSearch
                   (Curve *cv,IfcVector3 *val,IfcFloat a,IfcFloat b,uint samples,IfcFloat threshold,
                   uint recurse,uint max_recurse)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  IfcFloat IVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  
  if (samples < 2) {
    __assert_fail("samples>1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x20e,
                  "IfcFloat Assimp::IFC::RecursiveSearch(const Curve *, const IfcVector3 &, IfcFloat, IfcFloat, unsigned int, IfcFloat, unsigned int, unsigned int)"
                 );
  }
  dVar10 = b - a;
  dVar12 = INFINITY;
  IVar7 = a;
  dVar11 = INFINITY;
  uVar2 = samples;
  local_48 = a;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    (*cv->_vptr_Curve[3])(a,&local_60,cv);
    dVar8 = local_60 - val->x;
    dVar9 = local_58 - val->y;
    dVar5 = local_50 - val->z;
    dVar6 = dVar5 * dVar5 + dVar8 * dVar8 + dVar9 * dVar9;
    dVar5 = a;
    dVar8 = dVar6;
    dVar9 = IVar7;
    if ((dVar11 <= dVar6) &&
       (dVar5 = IVar7, dVar8 = dVar11, dVar11 = dVar12, dVar9 = b, dVar6 < dVar12)) {
      dVar11 = dVar6;
      dVar9 = a;
    }
    b = dVar9;
    dVar12 = dVar11;
    a = a + dVar10 / (double)samples;
    IVar7 = dVar5;
    dVar11 = dVar8;
  }
  if (dVar11 < INFINITY) {
    if (dVar12 < INFINITY) {
      if ((recurse < max_recurse) && (threshold <= ABS(local_48 - IVar7))) {
        dVar5 = b;
        iVar1 = (*cv->_vptr_Curve[2])(cv);
        dVar12 = IVar7;
        dVar10 = b;
        if ((char)iVar1 != '\0') {
          (*cv->_vptr_Curve[5])(cv);
          dVar5 = ABS(dVar5 - extraout_XMM0_Qa) * 0.5;
          if (dVar5 < ABS(IVar7 - b)) {
            (*cv->_vptr_Curve[5])(cv);
            (*cv->_vptr_Curve[3])(&local_60,cv);
            local_60 = local_60 - val->x;
            local_58 = local_58 - val->y;
            local_50 = local_50 - val->z;
            dVar8 = local_50 * local_50 + local_60 * local_60 + local_58 * local_58;
            uVar4 = -(ulong)(dVar8 < dVar11);
            dVar12 = (double)(~uVar4 & (ulong)IVar7 |
                             (~-(ulong)(IVar7 < b) & (ulong)dVar5 |
                             extraout_XMM0_Qa_00 & -(ulong)(IVar7 < b)) & uVar4);
            dVar10 = IVar7;
            if (dVar11 <= dVar8) {
              dVar10 = b;
            }
          }
        }
        IVar7 = RecursiveSearch(cv,val,dVar12,dVar10,samples,threshold,recurse + 1,max_recurse);
      }
      return IVar7;
    }
    __assert_fail("min_diff[ 1 ] != inf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x224,
                  "IfcFloat Assimp::IFC::RecursiveSearch(const Curve *, const IfcVector3 &, IfcFloat, IfcFloat, unsigned int, IfcFloat, unsigned int, unsigned int)"
                 );
  }
  __assert_fail("min_diff[ 0 ] != inf",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0x223,
                "IfcFloat Assimp::IFC::RecursiveSearch(const Curve *, const IfcVector3 &, IfcFloat, IfcFloat, unsigned int, IfcFloat, unsigned int, unsigned int)"
               );
}

Assistant:

IfcFloat RecursiveSearch(const Curve* cv, const IfcVector3& val, IfcFloat a, IfcFloat b,
        unsigned int samples, IfcFloat threshold, unsigned int recurse = 0, unsigned int max_recurse = 15) {
    ai_assert(samples>1);

    const IfcFloat delta = (b-a)/samples, inf = std::numeric_limits<IfcFloat>::infinity();
    IfcFloat min_point[2] = {a,b}, min_diff[2] = {inf,inf};
    IfcFloat runner = a;

    for (unsigned int i = 0; i < samples; ++i, runner += delta) {
        const IfcFloat diff = (cv->Eval(runner)-val).SquareLength();
        if (diff < min_diff[0]) {
            min_diff[1] = min_diff[0];
            min_point[1] = min_point[0];

            min_diff[0] = diff;
            min_point[0] = runner;
        }
        else if (diff < min_diff[1]) {
            min_diff[1] = diff;
            min_point[1] = runner;
        }
    }

    ai_assert( min_diff[ 0 ] != inf );
    ai_assert( min_diff[ 1 ] != inf );
    if ( std::fabs(a-min_point[0]) < threshold || recurse >= max_recurse) {
        return min_point[0];
    }

    // fix for closed curves to take their wrap-over into account
    if (cv->IsClosed() && std::fabs(min_point[0]-min_point[1]) > cv->GetParametricRangeDelta()*0.5  ) {
        const Curve::ParamRange& range = cv->GetParametricRange();
        const IfcFloat wrapdiff = (cv->Eval(range.first)-val).SquareLength();

        if (wrapdiff < min_diff[0]) {
            const IfcFloat t = min_point[0];
            min_point[0] = min_point[1] > min_point[0] ? range.first : range.second;
             min_point[1] = t;
        }
    }

    return RecursiveSearch(cv,val,min_point[0],min_point[1],samples,threshold,recurse+1,max_recurse);
}